

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StackSwitch *curr,
          optional<wasm::HeapType> ct)

{
  Expression **ppEVar1;
  HeapTypeKind HVar2;
  size_t sVar3;
  Type *pTVar4;
  ulong uVar5;
  long lVar6;
  Signature SVar7;
  Iterator local_60;
  Type local_50;
  Type params;
  _Storage<wasm::HeapType,_true> local_40;
  char local_38;
  
  local_40 = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_38 = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  params.id = (uintptr_t)this;
  if (((undefined1  [16])
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_40._M_value = wasm::Type::getHeapType(&curr->cont->type);
    if (local_38 == '\0') {
      local_38 = '\x01';
    }
  }
  HVar2 = HeapType::getKind(&local_40._M_value);
  if (HVar2 != Cont) {
    __assert_fail("ct->isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x48a,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  local_60.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)HeapType::getContinuation(&local_40._M_value);
  SVar7 = HeapType::getSignature((HeapType *)&local_60);
  local_50 = SVar7.params.id;
  sVar3 = wasm::Type::size(&local_50);
  if (sVar3 != 0) {
    sVar3 = wasm::Type::size(&local_50);
    if (sVar3 - 1 ==
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      sVar3 = wasm::Type::size(&local_50);
      if (sVar3 != 1) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          if ((curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar5) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          ppEVar1 = (curr->operands).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
          local_60.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               &local_50;
          local_60.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar5
          ;
          pTVar4 = wasm::Type::Iterator::operator*(&local_60);
          IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                    ((ConstraintCollector *)params.id,(Expression **)((long)ppEVar1 + lVar6),
                     (Type)pTVar4->id);
          uVar5 = uVar5 + 1;
          sVar3 = wasm::Type::size(&local_50);
          lVar6 = lVar6 + 8;
        } while (uVar5 < sVar3 - 1);
      }
      if (((uint)(0x7c < (ulong)local_40) * 4 + 3 & local_40._0_4_) == 0) {
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)params.id,&curr->cont,(Type)((ulong)local_40 | 2));
        return;
      }
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
  }
  __assert_fail("params.size() >= 1 && ((params.size() - 1) == curr->operands.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x48d,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitStackSwitch(StackSwitch* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = ct->getContinuation().type.getSignature().params;
    assert(params.size() >= 1 &&
           ((params.size() - 1) == curr->operands.size()));
    for (size_t i = 0; i < params.size() - 1; ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }